

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O1

void duckdb::TableScanSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               TableFunction *function)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  optional_ptr<duckdb::FunctionData,_true> oVar3;
  string *psVar4;
  vector<long,_false> local_38;
  optional_ptr<duckdb::FunctionData,_true> local_20;
  
  local_20.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_20);
  oVar3 = local_20;
  psVar4 = Catalog::GetName_abi_cxx11_
                     (*(Catalog **)(local_20.ptr[4]._vptr_FunctionData[0x1c] + 0xd8));
  (*serializer->_vptr_Serializer[2])(serializer,100,"catalog");
  (*serializer->_vptr_Serializer[0x1c])(serializer,psVar4);
  (*serializer->_vptr_Serializer[3])(serializer);
  p_Var1 = oVar3.ptr[4]._vptr_FunctionData[0x1c];
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"schema");
  (*serializer->_vptr_Serializer[0x1c])(serializer,p_Var1 + 0x20);
  (*serializer->_vptr_Serializer[3])(serializer);
  pp_Var2 = oVar3.ptr[4]._vptr_FunctionData;
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"table");
  (*serializer->_vptr_Serializer[0x1c])(serializer,pp_Var2 + 4);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"is_index_scan");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)*(byte *)&oVar3.ptr[5]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x68,"is_create_index");
  (*serializer->_vptr_Serializer[0xe])
            (serializer,(ulong)*(byte *)((long)&oVar3.ptr[5]._vptr_FunctionData + 1));
  (*serializer->_vptr_Serializer[3])(serializer);
  local_38.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Serializer::WritePropertyWithDefault<duckdb::vector<long,false>>
            (serializer,0x69,"result_ids",&local_38);
  if (local_38.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_38.super_vector<long,_std::allocator<long>_>.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  return;
}

Assistant:

static void TableScanSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const TableFunction &function) {
	auto &bind_data = bind_data_p->Cast<TableScanBindData>();
	serializer.WriteProperty(100, "catalog", bind_data.table.schema.catalog.GetName());
	serializer.WriteProperty(101, "schema", bind_data.table.schema.name);
	serializer.WriteProperty(102, "table", bind_data.table.name);
	serializer.WriteProperty(103, "is_index_scan", bind_data.is_index_scan);
	serializer.WriteProperty(104, "is_create_index", bind_data.is_create_index);
	serializer.WritePropertyWithDefault(105, "result_ids", unsafe_vector<row_t>());
}